

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<wchar_t>::parse(NFA<wchar_t> *this,Stream *stream)

{
  wchar_t ch;
  NFA<wchar_t> nfa;
  NFABase<Centaurus::NFABaseState<wchar_t,_int>_> NStack_48;
  
  ch = Stream::get(stream);
  while ((0x2f < (uint)ch || ((0x820000000001U >> ((ulong)(uint)ch & 0x3f) & 1) == 0))) {
    NFA((NFA<wchar_t> *)&NStack_48);
    parse_selection((NFA<wchar_t> *)&NStack_48,stream,ch);
    concat(this,(NFA<wchar_t> *)&NStack_48);
    NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::~NFABase(&NStack_48);
    ch = Stream::get(stream);
  }
  return;
}

Assistant:

void parse(Stream& stream)
    {
        for (wchar_t ch = stream.get(); ch != L')' && ch != L'/' && ch != L'\0'; ch = stream.get())
        {
            NFA<TCHAR> nfa;
            nfa.parse_selection(stream, ch);
            concat(nfa);
        }
    }